

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

int64_t Fixpp::impl::details::
        IndexesImpl<meta::pack::Pack<Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<80U,_Fixpp::Type::Float>_>_>
        ::of_binary_search(int tag)

{
  size_t index;
  int *piVar1;
  int64_t mid;
  int64_t high;
  int64_t low;
  int tag_local;
  
  high = 0;
  mid = 1;
  while( true ) {
    if (mid < high) {
      return -1;
    }
    index = (high + mid) / 2;
    piVar1 = const_array<int,_2UL>::operator[](&Sorted,index);
    if (*piVar1 == tag) break;
    piVar1 = const_array<int,_2UL>::operator[](&Sorted,index);
    if (*piVar1 < tag) {
      high = index + 1;
    }
    else {
      mid = index - 1;
    }
  }
  return index;
}

Assistant:

static int64_t of_binary_search(int tag)
                {
                    int64_t low = 0;
                    int64_t high = Size - 1;
                    while (low <= high) {
                       auto mid = (low + high) / 2;
                       if (Sorted[mid] == tag) return mid;
                       else if (Sorted[mid] < tag) low = mid + 1;
                       else high = mid - 1;
                    }
                    return -1;
                }